

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O2

void __thiscall
hta::storage::file::Exception::Exception
          (Exception *this,string *message,path *filename,int error_number)

{
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)message,": ");
  std::__cxx11::string::string((string *)&bStack_b8,(string *)filename);
  std::operator+(&local_78,&local_98,&bStack_b8);
  std::operator+(&local_58,&local_78,": ");
  __rhs = strerror(error_number);
  std::operator+(&local_38,&local_58,__rhs);
  hta::Exception::Exception(&this->super_Exception,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&bStack_b8);
  std::__cxx11::string::~string((string *)&local_98);
  *(undefined ***)&this->super_Exception = &PTR__Exception_00196c40;
  Catch::clara::std::filesystem::__cxx11::path::path((path *)&this->filename_,(path *)filename);
  this->errno_ = error_number;
  return;
}

Assistant:

Exception(const std::string& message, const std::filesystem::path& filename, int error_number)
    : hta::Exception(message + ": " + std::string(filename) + ": " + std::strerror(error_number)),
      filename_(filename), errno_(error_number)
    {
    }